

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrCompositionLayerBaseHeader *value)

{
  XrStructureType type;
  bool bVar1;
  XrResult XVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  allocator local_f9;
  string error_str;
  string local_d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_88;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_70;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_58;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_40;
  
  type = value->type;
  if (type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
    if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_HTC_passthrough"), bVar1)) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrCompositionLayerPassthroughHTC *)value);
      return XVar2;
    }
    std::__cxx11::string::string
              ((string *)&error_str,
               "XrCompositionLayerBaseHeader being used with child struct type ",
               (allocator *)&local_d8);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::string
              ((string *)&local_d8,"VUID-XrCompositionLayerBaseHeader-type-type",&local_f9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_b8,objects_info);
    CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_b8,&error_str);
    this = &local_b8;
  }
  else {
    if (type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrCompositionLayerQuad *)value);
      return XVar2;
    }
    if (type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
      if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
         (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                   "XR_KHR_composition_layer_cube"), bVar1)) {
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerCubeKHR *)value);
        return XVar2;
      }
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrCompositionLayerBaseHeader being used with child struct type ",
                 (allocator *)&local_d8);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::string
                ((string *)&local_d8,"VUID-XrCompositionLayerBaseHeader-type-type",&local_f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_40,objects_info);
      CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_40,&error_str);
      this = &local_40;
    }
    else if (type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
      if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
         (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                   "XR_KHR_composition_layer_cylinder"), bVar1)) {
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerCylinderKHR *)value);
        return XVar2;
      }
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrCompositionLayerBaseHeader being used with child struct type ",
                 (allocator *)&local_d8);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::string
                ((string *)&local_d8,"VUID-XrCompositionLayerBaseHeader-type-type",&local_f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_58,objects_info);
      CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_58,&error_str);
      this = &local_58;
    }
    else if (type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
      if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
         (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                   "XR_KHR_composition_layer_equirect"), bVar1)) {
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerEquirectKHR *)value);
        return XVar2;
      }
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrCompositionLayerBaseHeader being used with child struct type ",
                 (allocator *)&local_d8);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::string
                ((string *)&local_d8,"VUID-XrCompositionLayerBaseHeader-type-type",&local_f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_70,objects_info);
      CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_70,&error_str);
      this = &local_70;
    }
    else if (type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
      if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
         (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                   "XR_KHR_composition_layer_equirect2"), bVar1)) {
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerEquirect2KHR *)value);
        return XVar2;
      }
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrCompositionLayerBaseHeader being used with child struct type ",
                 (allocator *)&local_d8);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::string
                ((string *)&local_d8,"VUID-XrCompositionLayerBaseHeader-type-type",&local_f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_88,objects_info);
      CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_88,&error_str);
      this = &local_88;
    }
    else {
      if (type != XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
        if (type != XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
          InvalidStructureType
                    (instance_info,command_name,objects_info,"XrCompositionLayerBaseHeader",type,
                     "VUID-XrCompositionLayerBaseHeader-type-type",XR_TYPE_UNKNOWN,"");
          return XR_ERROR_VALIDATION_FAILURE;
        }
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerProjection *)value);
        return XVar2;
      }
      if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
         (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_FB_passthrough"), bVar1))
      {
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerPassthroughFB *)value);
        return XVar2;
      }
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrCompositionLayerBaseHeader being used with child struct type ",
                 (allocator *)&local_d8);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::string
                ((string *)&local_d8,"VUID-XrCompositionLayerBaseHeader-type-type",&local_f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_a0,objects_info);
      CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_a0,&error_str);
      this = &local_a0;
    }
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&error_str);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrCompositionLayerBaseHeader* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-next-next" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-layerFlags-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-space-parameter" because it is a base structure
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
        const XrCompositionLayerProjection* new_value = reinterpret_cast<const XrCompositionLayerProjection*>(value);
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
        const XrCompositionLayerQuad* new_value = reinterpret_cast<const XrCompositionLayerQuad*>(value);
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
        const XrCompositionLayerCubeKHR* new_value = reinterpret_cast<const XrCompositionLayerCubeKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_cube")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_CUBE_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_cube\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
        const XrCompositionLayerCylinderKHR* new_value = reinterpret_cast<const XrCompositionLayerCylinderKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_cylinder")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_cylinder\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
        const XrCompositionLayerEquirectKHR* new_value = reinterpret_cast<const XrCompositionLayerEquirectKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_equirect")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_equirect\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
        const XrCompositionLayerEquirect2KHR* new_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_equirect2")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_equirect2\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
        const XrCompositionLayerPassthroughFB* new_value = reinterpret_cast<const XrCompositionLayerPassthroughFB*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_passthrough")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB\"";
            error_str += " which requires extension \"XR_FB_passthrough\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
        const XrCompositionLayerPassthroughHTC* new_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_HTC_passthrough")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC\"";
            error_str += " which requires extension \"XR_HTC_passthrough\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrCompositionLayerBaseHeader",
                         value->type, "VUID-XrCompositionLayerBaseHeader-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}